

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void variance8_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                   __m128i *sum)

{
  int iVar1;
  long in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int iVar2;
  undefined4 in_register_00000084;
  __m128i *in_R9;
  __m128i *sum_00;
  __m128i alVar3;
  __m128i ref_00;
  __m128i r;
  __m128i s;
  int i;
  int local_54;
  uint8_t *local_40;
  uint8_t *local_30;
  
  iVar1 = (int)in_RCX;
  *(undefined8 *)r[1] = 0;
  *(undefined8 *)(r[1] + 8) = 0;
  (*in_R9)[0] = 0;
  (*in_R9)[1] = 0;
  iVar2 = in_R8D;
  sum_00 = in_R9;
  local_40 = in_RDX;
  local_30 = in_RDI;
  for (local_54 = 0; local_54 < in_R8D; local_54 = local_54 + 1) {
    load8_8to16_sse2(local_30);
    alVar3 = load8_8to16_sse2(local_40);
    ref_00[0] = alVar3[1];
    alVar3[1] = r[1];
    alVar3[0] = (longlong)in_R9;
    ref_00[1] = in_RCX;
    variance_kernel_sse2(alVar3,ref_00,(__m128i *)CONCAT44(in_register_00000084,iVar2),sum_00);
    local_30 = local_30 + in_ESI;
    in_RCX = (long)iVar1;
    local_40 = local_40 + in_RCX;
  }
  return;
}

Assistant:

static inline void variance8_sse2(const uint8_t *src, const int src_stride,
                                  const uint8_t *ref, const int ref_stride,
                                  const int h, __m128i *const sse,
                                  __m128i *const sum) {
  assert(h <= 128);  // May overflow for larger height.
  *sum = _mm_setzero_si128();
  *sse = _mm_setzero_si128();
  for (int i = 0; i < h; i++) {
    const __m128i s = load8_8to16_sse2(src);
    const __m128i r = load8_8to16_sse2(ref);

    variance_kernel_sse2(s, r, sse, sum);
    src += src_stride;
    ref += ref_stride;
  }
}